

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib586.c
# Opt level: O0

void * fire(void *ptr)

{
  int iVar1;
  long lVar2;
  int i;
  CURL *curl;
  Tdata *tdata;
  CURLcode code;
  void *ptr_local;
  
  lVar2 = curl_easy_init();
  if (lVar2 == 0) {
    curl_mfprintf(_stderr,"curl_easy_init() failed\n");
  }
  else {
    curl_easy_setopt(lVar2,0x40,0);
    curl_easy_setopt(lVar2,0x29,1);
    curl_easy_setopt(lVar2,0x2712,*(undefined8 *)((long)ptr + 8));
    curl_mprintf("CURLOPT_SHARE\n");
    curl_easy_setopt(lVar2,0x2774,*ptr);
    curl_mprintf("PERFORM\n");
    iVar1 = curl_easy_perform(lVar2);
    if (iVar1 != 0) {
      curl_mfprintf(_stderr,"perform url \'%s\' repeat %d failed, curlcode %d\n",
                    *(undefined8 *)((long)ptr + 8),0,iVar1);
    }
    curl_mprintf("CLEANUP\n");
    curl_easy_cleanup(lVar2);
  }
  return (void *)0x0;
}

Assistant:

static void *fire(void *ptr)
{
  CURLcode code;
  struct Tdata *tdata = (struct Tdata*)ptr;
  CURL *curl;
  int i=0;

  curl = curl_easy_init();
  if(!curl) {
    fprintf(stderr, "curl_easy_init() failed\n");
    return NULL;
  }

  curl_easy_setopt(curl, CURLOPT_SSL_VERIFYPEER, 0L);
  curl_easy_setopt(curl, CURLOPT_VERBOSE,    1L);
  curl_easy_setopt(curl, CURLOPT_URL,        tdata->url);
  printf("CURLOPT_SHARE\n");
  curl_easy_setopt(curl, CURLOPT_SHARE, tdata->share);

  printf("PERFORM\n");
  code = curl_easy_perform(curl);
  if(code != CURLE_OK) {
    fprintf(stderr, "perform url '%s' repeat %d failed, curlcode %d\n",
            tdata->url, i, (int)code);
  }

  printf("CLEANUP\n");
  curl_easy_cleanup(curl);

  return NULL;
}